

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfusionstyle.cpp
# Opt level: O1

void __thiscall QFusionStyle::unpolish(QFusionStyle *this,QWidget *widget)

{
  long lVar1;
  
  QCommonStyle::unpolish(&this->super_QCommonStyle,widget);
  lVar1 = QMetaObject::cast((QObject *)&QAbstractButton::staticMetaObject);
  if (lVar1 == 0) {
    lVar1 = QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
    if (lVar1 == 0) {
      lVar1 = QMetaObject::cast((QObject *)&QProgressBar::staticMetaObject);
      if (lVar1 == 0) {
        lVar1 = QMetaObject::cast((QObject *)&QScrollBar::staticMetaObject);
        if (lVar1 == 0) {
          lVar1 = QMetaObject::cast((QObject *)&QSplitterHandle::staticMetaObject);
          if (lVar1 == 0) {
            lVar1 = QMetaObject::cast((QObject *)&QAbstractSlider::staticMetaObject);
            if (lVar1 == 0) {
              lVar1 = QMetaObject::cast((QObject *)&QAbstractSpinBox::staticMetaObject);
              if (lVar1 == 0) {
                lVar1 = (**(code **)(*(long *)widget + 8))(widget,"QDockSeparator");
                if (lVar1 == 0) {
                  lVar1 = (**(code **)(*(long *)widget + 8))(widget,"QDockWidgetSeparator");
                  if (lVar1 == 0) {
                    return;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  QWidget::setAttribute(widget,WA_Hover,false);
  return;
}

Assistant:

void QFusionStyle::unpolish(QWidget *widget)
{
    QCommonStyle::unpolish(widget);
    if (false
#if QT_CONFIG(abstractbutton)
            || qobject_cast<QAbstractButton*>(widget)
#endif
#if QT_CONFIG(combobox)
            || qobject_cast<QComboBox *>(widget)
#endif
#if QT_CONFIG(progressbar)
            || qobject_cast<QProgressBar *>(widget)
#endif
#if QT_CONFIG(scrollbar)
            || qobject_cast<QScrollBar *>(widget)
#endif
#if QT_CONFIG(splitter)
            || qobject_cast<QSplitterHandle *>(widget)
#endif
#if QT_CONFIG(abstractslider)
            || qobject_cast<QAbstractSlider *>(widget)
#endif
#if QT_CONFIG(spinbox)
            || qobject_cast<QAbstractSpinBox *>(widget)
#endif
            || (widget->inherits("QDockSeparator"))
            || (widget->inherits("QDockWidgetSeparator"))
            ) {
        widget->setAttribute(Qt::WA_Hover, false);
    }
}